

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O3

void __thiscall
GeneralHash<1,_unsigned_int,_unsigned_char>::GeneralHash
          (GeneralHash<1,_unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  pointer puVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  allocator_type local_19;
  
  this->hashvalue = 0;
  this->wordsize = mywordsize;
  this->n = myn;
  this->irreduciblepoly = 0;
  uVar2 = maskfnc<unsigned_int>(mywordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,uVar2);
  this->lastbit = 1 << ((byte)this->wordsize & 0x1f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->precomputedshift,(long)(1 << ((byte)this->n & 0x1f)),&local_19);
  if (this->wordsize == 0x13) {
    uVar2 = 0x80027;
  }
  else {
    if (this->wordsize != 9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unsupported wordsize ",0x15);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->wordsize);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," bits, try 19 or 9",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      goto LAB_0010a2e6;
    }
    uVar2 = 0x22d;
  }
  this->irreduciblepoly = uVar2;
LAB_0010a2e6:
  puVar1 = (this->precomputedshift).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->precomputedshift).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar4 != 0) {
    uVar5 = 0;
    do {
      iVar6 = this->n;
      uVar2 = (int)uVar5 << ((char)this->wordsize - (char)iVar6 & 0x1fU);
      if (0 < iVar6) {
        do {
          uVar7 = this->irreduciblepoly;
          if ((this->lastbit & ~(uVar2 * 2)) != 0) {
            uVar7 = 0;
          }
          uVar2 = uVar2 * 2 ^ uVar7;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      puVar1[uVar5] = uVar2;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < (ulong)(lVar4 >> 2));
  }
  return;
}

Assistant:

GeneralHash(int myn, int mywordsize = 19)
      : hashvalue(0), wordsize(mywordsize), n(myn), irreduciblepoly(0),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        lastbit(static_cast<hashvaluetype>(1) << wordsize),
        precomputedshift(precomputationtype == FULLPRECOMP ? (1 << n) : 0) {
    if (wordsize == 19) {
      irreduciblepoly = 1 + (1 << 1) + (1 << 2) + (1 << 5) + (1 << 19);
    } else if (wordsize == 9) {
      irreduciblepoly = 1 + (1 << 2) + (1 << 3) + (1 << 5) + (1 << 9);
    } else {
      cerr << "unsupported wordsize " << wordsize << " bits, try 19 or 9"
           << endl;
    }
    // in case the precomp is activated at the template level
    if (precomputationtype == FULLPRECOMP) {
      for (hashvaluetype x = 0; x < precomputedshift.size(); ++x) {
        hashvaluetype leftover = x << (wordsize - n);
        fastleftshift(leftover, n);
        precomputedshift[x] = leftover;
      }
    }
  }